

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

void __thiscall
Assimp::AMFImporter::Throw_MoreThanOnceDefined
          (AMFImporter *this,string *pNodeType,string *pDescription)

{
  int iVar1;
  DeadlyImportError *this_00;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *pDescription_local;
  string *pNodeType_local;
  AMFImporter *this_local;
  
  local_20 = pDescription;
  pDescription_local = pNodeType;
  pNodeType_local = (string *)this;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_c0,"\"",pDescription_local);
  std::operator+(&local_a0,&local_c0,"\" node can be used only once in ");
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::operator+(&local_80,&local_a0,(char *)CONCAT44(extraout_var,iVar1));
  std::operator+(&local_60,&local_80,". Description: ");
  std::operator+(&local_40,&local_60,local_20);
  DeadlyImportError::DeadlyImportError(this_00,&local_40);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void AMFImporter::Throw_MoreThanOnceDefined(const std::string& pNodeType, const std::string& pDescription)
{
	throw DeadlyImportError("\"" + pNodeType + "\" node can be used only once in " + mReader->getNodeName() + ". Description: " + pDescription);
}